

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali_variant.c
# Opt level: O0

size_t cali_variant_get_size(cali_variant_t v)

{
  ulong uVar1;
  undefined4 local_30;
  cali_attr_type type;
  uint64_t t;
  cali_variant_t v_local;
  
  uVar1 = v.type_and_size & 0xff;
  if (uVar1 < 10) {
    local_30 = (undefined4)uVar1;
  }
  else {
    local_30 = 0;
  }
  switch(local_30) {
  case 0:
    v_local.value.v_uint = 0;
    break;
  case 1:
  case 4:
    v_local.value.v_uint = v.type_and_size >> 0x20;
    break;
  case 2:
  case 3:
  case 5:
    v_local.value.v_uint = 8;
    break;
  case 6:
    v_local.value.v_uint = 8;
    break;
  case 7:
    v_local.value.v_uint = 1;
    break;
  case 8:
    v_local.value.v_uint = 4;
    break;
  case 9:
    v_local.value.v_uint = 8;
    break;
  default:
    v_local.value.v_uint = 0;
  }
  return v_local.value.v_uint;
}

Assistant:

size_t cali_variant_get_size(cali_variant_t v)
{
    uint64_t       t    = _EXTRACT_TYPE(v.type_and_size);
    cali_attr_type type = (t <= CALI_MAXTYPE ? (cali_attr_type) t : CALI_TYPE_INV);

    switch (type) {
    case CALI_TYPE_INV:
        return 0;
    case CALI_TYPE_USR:
    case CALI_TYPE_STRING:
        return _EXTRACT_SIZE(v.type_and_size);
    case CALI_TYPE_INT:
    case CALI_TYPE_UINT:
    case CALI_TYPE_ADDR:
        return sizeof(uint64_t);
    case CALI_TYPE_DOUBLE:
        return sizeof(double);
    case CALI_TYPE_BOOL:
        return sizeof(bool);
    case CALI_TYPE_TYPE:
        return sizeof(cali_attr_type);
    case CALI_TYPE_PTR:
        return sizeof(void*);
    }

    return 0;
}